

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O1

QString * QtPrivate::QStringList_join
                    (QString *__return_storage_ptr__,QStringList *that,QChar *sep,qsizetype seplen)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  QStringList *__range2;
  long lVar5;
  
  lVar5 = (that->d).size;
  if (lVar5 == 0) {
    lVar4 = 0;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar4 = lVar4 + seplen + *(long *)((long)&(((that->d).ptr)->d).size + lVar3);
      lVar3 = lVar3 + 0x18;
    } while (lVar5 * 0x18 != lVar3);
    lVar4 = lVar4 - seplen;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (lVar4 != 0) {
    pDVar2 = (__return_storage_ptr__->d).d;
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar2->super_QArrayData).alloc -
        ((long)((long)(__return_storage_ptr__->d).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar4)) {
      lVar3 = (__return_storage_ptr__->d).size;
      if (lVar4 < lVar3) {
        lVar4 = lVar3;
      }
      QString::reallocData(__return_storage_ptr__,lVar4,KeepSize);
    }
    pDVar2 = (__return_storage_ptr__->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    if (lVar5 != 0) {
      lVar4 = 0;
      do {
        if (lVar4 != 0) {
          QString::append(__return_storage_ptr__,sep,seplen);
        }
        QString::append(__return_storage_ptr__,(QString *)((long)&(((that->d).ptr)->d).d + lVar4));
        lVar4 = lVar4 + 0x18;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QtPrivate::QStringList_join(const QStringList *that, const QChar *sep, qsizetype seplen)
{
    const qsizetype totalLength = accumulatedSize(*that, seplen);
    const qsizetype size = that->size();

    QString res;
    if (totalLength == 0)
        return res;
    res.reserve(totalLength);
    for (qsizetype i = 0; i < size; ++i) {
        if (i)
            res.append(sep, seplen);
        res += that->at(i);
    }
    return res;
}